

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

uint ghc::filesystem::detail::consumeUtf8Fragment(uint state,uint8_t fragment,uint32_t *codepoint)

{
  uint uVar1;
  undefined7 in_register_00000031;
  uint uVar2;
  
  uVar2 = 0;
  uVar1 = (uint)CONCAT71(in_register_00000031,fragment);
  if ((char)fragment < '\0') {
    uVar2 = *(uint *)((long)consumeUtf8Fragment::utf8_state_info +
                     (ulong)((uint)(CONCAT71(in_register_00000031,fragment) >> 1) & 0x3c)) >>
            (fragment * '\x04' & 0x1f) & 0xf;
  }
  if (state == 0) {
    *codepoint = 0xffU >> (sbyte)uVar2 & uVar1;
  }
  else {
    *codepoint = uVar1 & 0x3f | *codepoint << 6;
    if (state == 8) {
      return 8;
    }
  }
  return consumeUtf8Fragment::utf8_state_info[(ulong)uVar2 + 0x10] >> ((byte)(state << 2) & 0x1f) &
         0xf;
}

Assistant:

GHC_INLINE unsigned consumeUtf8Fragment(const unsigned state, const uint8_t fragment, uint32_t& codepoint)
{
    static const uint32_t utf8_state_info[] = {
        // encoded states
        0x11111111u, 0x11111111u, 0x77777777u, 0x77777777u, 0x88888888u, 0x88888888u, 0x88888888u, 0x88888888u, 0x22222299u, 0x22222222u, 0x22222222u, 0x22222222u, 0x3333333au, 0x33433333u, 0x9995666bu, 0x99999999u,
        0x88888880u, 0x22818108u, 0x88888881u, 0x88888882u, 0x88888884u, 0x88888887u, 0x88888886u, 0x82218108u, 0x82281108u, 0x88888888u, 0x88888883u, 0x88888885u, 0u,          0u,          0u,          0u,
    };
    uint8_t category = fragment < 128 ? 0 : (utf8_state_info[(fragment >> 3) & 0xf] >> ((fragment & 7) << 2)) & 0xf;
    codepoint = (state ? (codepoint << 6) | (fragment & 0x3fu) : (0xffu >> category) & fragment);
    return state == S_RJCT ? static_cast<unsigned>(S_RJCT) : static_cast<unsigned>((utf8_state_info[category + 16] >> (state << 2)) & 0xf);
}